

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Voice::set(V2Voice *this,syVV2 *para)

{
  long lVar1;
  V2Osc *this_00;
  V2Env *this_01;
  V2Flt *this_02;
  V2LFO *this_03;
  float fVar2;
  float fVar3;
  float fVar4;
  
  this->xpose = para->transp + -64.0;
  updateNote(this);
  this->fmode = (int)para->routing;
  this->keysync = (int)para->oscsync;
  fVar3 = para->panning * 0.0078125;
  fVar2 = 1.0 - fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  this->lvol = fVar2;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar4 = 1.0;
  this->rvol = fVar3;
  fVar2 = (para->fltbal + -64.0) * 0.015625;
  if (fVar2 < 0.0) {
    fVar4 = fVar2 + 1.0;
  }
  this->f1gain = (float)(-(uint)(fVar2 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar2 < 0.0) & (uint)(1.0 - fVar2));
  this->f2gain = fVar4;
  this_00 = this->osc;
  for (lVar1 = 8; lVar1 != 0x50; lVar1 = lVar1 + 0x18) {
    V2Osc::set(this_00,(syVOsc *)((long)para->osc + lVar1 + -8));
    this_00 = this_00 + 1;
  }
  this_01 = this->env;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    V2Env::set(this_01,(syVEnv *)((long)&para->env[0].ar + lVar1));
    this_01 = this_01 + 1;
  }
  this_02 = this->vcf;
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 0xc) {
    V2Flt::set(this_02,(syVFlt *)((long)&para->flt[0].mode + lVar1));
    this_02 = this_02 + 1;
  }
  this_03 = this->lfo;
  for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 0x1c) {
    V2LFO::set(this_03,(syVLFO *)((long)&para->lfo[0].mode + lVar1));
    this_03 = this_03 + 1;
  }
  V2Dist::set(&this->dist,&para->dist);
  return;
}

Assistant:

void set(const syVV2 *para)
    {
        xpose = para->transp - 64.0f;
        updateNote();

        fmode = (int)para->routing;
        keysync = (int)para->oscsync;

        // equal power panning
        float p = para->panning / 128.0f;
        lvol = sqrtf(1.0f - p);
        rvol = sqrtf(p);

        // filter balance for parallel
        float x = (para->fltbal - 64.0f) / 64.0f;
        if (x >= 0.0f)
        {
            f2gain = 1.0f;
            f1gain = 1.0f - x;
        }
        else
        {
            f1gain = 1.0f;
            f2gain = 1.0f + x;
        }

        // subsections
        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].set(&para->osc[i]);

        for (int i=0; i < syVV2::NENV; i++)
            env[i].set(&para->env[i]);

        for (int i=0; i < syVV2::NFLT; i++)
            vcf[i].set(&para->flt[i]);

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].set(&para->lfo[i]);

        dist.set(&para->dist);
    }